

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

void __thiscall diligent_spirv_cross::Bitset::merge_or(Bitset *this,Bitset *other)

{
  bool bVar1;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_00;
  undefined1 extraout_DL;
  undefined7 extraout_var;
  value_type_conflict *v;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *__range2;
  Bitset *other_local;
  Bitset *this_local;
  
  this->lower = other->lower | this->lower;
  __end2 = ::std::
           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           ::begin(&other->higher);
  v = (value_type_conflict *)
      ::std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::end(&other->higher);
  while( true ) {
    bVar1 = ::std::__detail::operator!=
                      (&__end2.super__Node_iterator_base<unsigned_int,_false>,
                       (_Node_iterator_base<unsigned_int,_false> *)&v);
    if (!bVar1) break;
    this_00 = (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               *)::std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator*
                           (&__end2);
    ::std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::insert((pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)&this->higher,
             this_00,(value_type *)CONCAT71(extraout_var,extraout_DL));
    ::std::__detail::_Node_const_iterator<unsigned_int,_true,_false>::operator++(&__end2);
  }
  return;
}

Assistant:

inline void merge_or(const Bitset &other)
	{
		lower |= other.lower;
		for (auto &v : other.higher)
			higher.insert(v);
	}